

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::ContainerEqMatcher<std::vector<unsigned_long,std::allocator<unsigned_long>>>::
MatchAndExplain<std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (ContainerEqMatcher<std::vector<unsigned_long,std::allocator<unsigned_long>>> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *lhs,MatchResultListener *listener)

{
  pointer puVar1;
  ostream *poVar2;
  unsigned_long *puVar3;
  int iVar4;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  it_1;
  unsigned_long *puVar5;
  pointer puVar6;
  size_t __n;
  unsigned_long *puVar7;
  pointer puVar8;
  bool bVar9;
  const_iterator it;
  char *pcVar10;
  bool bVar11;
  
  puVar6 = (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)puVar1 - (long)puVar6;
  if (__n == *(long *)(this + 8) - (long)*(void **)this) {
    if (puVar1 == puVar6) {
      bVar11 = true;
    }
    else {
      iVar4 = bcmp(puVar6,*(void **)this,__n);
      bVar11 = iVar4 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  if ((!bVar11) && (poVar2 = listener->stream_, poVar2 != (ostream *)0x0)) {
    if (puVar6 == (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
      pcVar10 = "which";
    }
    else {
      bVar9 = false;
      do {
        puVar5 = *(unsigned_long **)this;
        puVar3 = *(unsigned_long **)(this + 8);
        puVar7 = puVar3;
        if (puVar5 != puVar3) {
          do {
            puVar7 = puVar5;
            if (*puVar5 == *puVar6) break;
            puVar5 = puVar5 + 1;
            puVar7 = puVar3;
          } while (puVar5 != puVar3);
        }
        if (puVar7 == puVar3) {
          if (bVar9) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar2,"which has these unexpected elements: ",0x25);
            bVar9 = true;
          }
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        }
        puVar6 = puVar6 + 1;
      } while (puVar6 != (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                         _M_impl.super__Vector_impl_data._M_finish);
      pcVar10 = "which";
      if (bVar9) {
        pcVar10 = ",\nand";
      }
    }
    puVar5 = *(unsigned_long **)this;
    if (puVar5 != *(unsigned_long **)(this + 8)) {
      bVar9 = false;
      do {
        puVar6 = (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar1 = (lhs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar8 = puVar1;
        if (puVar6 != puVar1) {
          do {
            puVar8 = puVar6;
            if (*puVar6 == *puVar5) break;
            puVar6 = puVar6 + 1;
            puVar8 = puVar1;
          } while (puVar6 != puVar1);
        }
        if (puVar8 == puVar1) {
          if (bVar9) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar10,5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar2," doesn\'t have these expected elements: ",0x27);
            bVar9 = true;
          }
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        }
        puVar5 = puVar5 + 1;
      } while (puVar5 != *(unsigned_long **)(this + 8));
    }
  }
  return bVar11;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    typedef typename LhsView::type LhsStlContainer;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_)
      return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (typename LhsStlContainer::const_iterator it =
               lhs_stl_container.begin();
           it != lhs_stl_container.end(); ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (typename StlContainer::const_iterator it = expected_.begin();
           it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(
                lhs_stl_container.begin(), lhs_stl_container.end(), *it) ==
            lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }